

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForField
          (Generator *this,GeneratorOptions *options,FieldDescriptor *field,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards)

{
  Type TVar1;
  GeneratorOptions *pGVar2;
  Descriptor *pDVar3;
  EnumDescriptor *descriptor;
  string local_48;
  
  descriptor = (EnumDescriptor *)required;
  TVar1 = FieldDescriptor::type(field);
  if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 8) &&
     ((field[0x50] != (FieldDescriptor)0x1 || (*(long *)(field + 0x68) != 0)))) {
    if (options->add_require_for_enums == true) {
      pGVar2 = (GeneratorOptions *)FieldDescriptor::enum_type(field);
      (anonymous_namespace)::GetEnumPath_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)options,pGVar2,descriptor);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)required,&local_48);
    }
    else {
      pGVar2 = (GeneratorOptions *)FieldDescriptor::enum_type(field);
      (anonymous_namespace)::GetEnumPath_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)options,pGVar2,descriptor);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)forwards,&local_48);
    }
  }
  else {
    TVar1 = FieldDescriptor::type(field);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != 10) {
      return;
    }
    pDVar3 = FieldDescriptor::message_type(field);
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6b) != '\0') {
      return;
    }
    pGVar2 = (GeneratorOptions *)FieldDescriptor::message_type(field);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)options,pGVar2,(Descriptor *)descriptor);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)required,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::FindRequiresForField(const GeneratorOptions& options,
                                     const FieldDescriptor* field,
                                     std::set<string>* required,
                                     std::set<string>* forwards) const {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
        // N.B.: file-level extensions with enum type do *not* create
        // dependencies, as per original codegen.
        !(field->is_extension() && field->extension_scope() == NULL)) {
      if (options.add_require_for_enums) {
        required->insert(GetEnumPath(options, field->enum_type()));
      } else {
        forwards->insert(GetEnumPath(options, field->enum_type()));
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!IgnoreMessage(options, field->message_type())) {
        required->insert(GetMessagePath(options, field->message_type()));
      }
    }
}